

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_bitstream.c
# Opt level: O0

UWORD32 ihevcd_bits_get(bitstrm_t *ps_bitstrm,UWORD32 u4_numbits)

{
  uint uVar1;
  uint *puVar2;
  uint local_18;
  UWORD32 pu4_word_tmp;
  UWORD32 u4_bits_read;
  UWORD32 u4_numbits_local;
  bitstrm_t *ps_bitstrm_local;
  
  u4_bits_read = (ps_bitstrm->u4_cur_word << ((byte)ps_bitstrm->u4_bit_ofst & 0x1f)) >>
                 (0x20U - (char)u4_numbits & 0x1f);
  ps_bitstrm->u4_bit_ofst = u4_numbits + ps_bitstrm->u4_bit_ofst;
  if (0x20 < ps_bitstrm->u4_bit_ofst) {
    if (0x40 - ps_bitstrm->u4_bit_ofst < 0x20) {
      local_18 = ps_bitstrm->u4_nxt_word >> (0x40U - (char)ps_bitstrm->u4_bit_ofst & 0x1f);
    }
    else {
      local_18 = 0;
    }
    u4_bits_read = local_18 | u4_bits_read;
  }
  if (0x1f < ps_bitstrm->u4_bit_ofst) {
    ps_bitstrm->u4_cur_word = ps_bitstrm->u4_nxt_word;
    puVar2 = ps_bitstrm->pu4_buf;
    ps_bitstrm->pu4_buf = puVar2 + 1;
    uVar1 = *puVar2;
    ps_bitstrm->u4_bit_ofst = ps_bitstrm->u4_bit_ofst - 0x20;
    ps_bitstrm->u4_nxt_word =
         uVar1 << 0x18 | (uVar1 & 0xff00) << 8 | (uVar1 & 0xff0000) >> 8 | uVar1 >> 0x18;
  }
  return u4_bits_read;
}

Assistant:

UWORD32 ihevcd_bits_get(bitstrm_t *ps_bitstrm, UWORD32 u4_numbits)
{
    UWORD32 u4_bits_read;

    BITS_GET(u4_bits_read,
             ps_bitstrm->pu4_buf,
             ps_bitstrm->u4_bit_ofst,
             ps_bitstrm->u4_cur_word,
             ps_bitstrm->u4_nxt_word,
             u4_numbits);
    return u4_bits_read;

}